

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpointingdevice.cpp
# Opt level: O2

void __thiscall
QPointingDevicePrivate::sendTouchCancelEvent(QPointingDevicePrivate *this,QTouchEvent *cancelEvent)

{
  bool bVar1;
  QObject *pQVar2;
  long lVar3;
  EventPointData *epd;
  QPointer *this_00;
  QEventPoint *point;
  
  if ((cancelEvent->super_QPointerEvent).m_points.d.size == 0) {
    point = (QEventPoint *)
            (this->activePoints).c.values.super_QVLABase<QPointingDevicePrivate::EventPointData>.
            super_QVLABaseBase.ptr;
    for (lVar3 = (this->activePoints).c.values.
                 super_QVLABase<QPointingDevicePrivate::EventPointData>.super_QVLABaseBase.s * 0x58;
        lVar3 != 0; lVar3 = lVar3 + -0x58) {
      bVar1 = QPointer::operator_cast_to_bool((QPointer *)(point + 1));
      if (bVar1) {
        QMutableTouchEvent::addPoint(cancelEvent,point);
      }
      point = point + 0xb;
    }
  }
  this_00 = (QPointer *)
            ((long)(this->activePoints).c.values.
                   super_QVLABase<QPointingDevicePrivate::EventPointData>.super_QVLABaseBase.ptr + 8
            );
  for (lVar3 = (this->activePoints).c.values.super_QVLABase<QPointingDevicePrivate::EventPointData>.
               super_QVLABaseBase.s * 0x58; lVar3 != 0; lVar3 = lVar3 + -0x58) {
    bVar1 = QPointer::operator_cast_to_bool(this_00);
    if (bVar1) {
      if ((*(long *)this_00 == 0) || (*(int *)(*(long *)this_00 + 4) == 0)) {
        pQVar2 = (QObject *)0x0;
      }
      else {
        pQVar2 = *(QObject **)(this_00 + 8);
      }
      QCoreApplication::sendEvent(pQVar2,(QEvent *)cancelEvent);
    }
    QPointerEvent::setExclusiveGrabber
              (&cancelEvent->super_QPointerEvent,(QEventPoint *)(this_00 + -8),(QObject *)0x0);
    QPointerEvent::clearPassiveGrabbers
              (&cancelEvent->super_QPointerEvent,(QEventPoint *)(this_00 + -8));
    this_00 = this_00 + 0x58;
  }
  return;
}

Assistant:

void QPointingDevicePrivate::sendTouchCancelEvent(QTouchEvent *cancelEvent)
{
    // An incoming TouchCancel event will typically not contain any points, but
    // QQuickPointerHandler::onGrabChanged needs to be called for each point
    // that has an exclusive grabber. Adding those points to the event makes it
    // an easy iteration there.
    if (cancelEvent->points().isEmpty()) {
        for (auto &epd : activePoints.values()) {
            if (epd.exclusiveGrabber)
                QMutableTouchEvent::addPoint(cancelEvent, epd.eventPoint);
        }
    }
    for (auto &epd : activePoints.values()) {
        if (epd.exclusiveGrabber)
            QCoreApplication::sendEvent(epd.exclusiveGrabber, cancelEvent);
        // The next touch event can only be a TouchBegin, so clean up.
        cancelEvent->setExclusiveGrabber(epd.eventPoint, nullptr);
        cancelEvent->clearPassiveGrabbers(epd.eventPoint);
    }
}